

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_v4dwt_decode(opj_v4dwt_t *dwt)

{
  opj_v4_t *w;
  opj_v4_t *w_00;
  OPJ_INT32 count;
  OPJ_INT32 m;
  OPJ_INT32 m_00;
  int iVar1;
  int iVar2;
  opj_v4_t *w_01;
  opj_v4_t *poVar3;
  int count_00;
  undefined8 in_XMM1_Qa;
  __m128 c;
  __m128 c_00;
  __m128 c_01;
  __m128 c_02;
  __m128 c_03;
  __m128 c_04;
  
  if (dwt->cas == 0) {
    count_00 = dwt->sn;
    if (1 < count_00 || 0 < dwt->dn) {
      iVar2 = 1;
      iVar1 = 0;
      goto LAB_00109b66;
    }
  }
  else {
    count_00 = dwt->sn;
    iVar2 = 0;
    iVar1 = 1;
    if ((0 < count_00) || (1 < dwt->dn)) {
LAB_00109b66:
      poVar3 = dwt->wavelet;
      w = (opj_v4_t *)((ulong)(uint)(iVar1 << 4) + (long)poVar3);
      c._8_8_ = in_XMM1_Qa;
      c[0] = 1.2301741;
      c[1] = 1.2301741;
      opj_v4dwt_decode_step1_sse(w,count_00,c);
      w_00 = (opj_v4_t *)((ulong)(uint)(iVar2 << 4) + (long)poVar3);
      count = dwt->dn;
      c_00[2] = (float)(int)in_XMM1_Qa;
      c_00[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      c_00[0] = 1.6257324;
      c_00[1] = 1.6257324;
      opj_v4dwt_decode_step1_sse(w_00,count,c_00);
      w_01 = (opj_v4_t *)((long)poVar3 + (ulong)(uint)(iVar1 << 4) + 0x10);
      m = count - iVar1;
      if (count_00 < count - iVar1) {
        m = count_00;
      }
      c_01[2] = (float)(int)in_XMM1_Qa;
      c_01[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      c_01[0] = -0.44350687;
      c_01[1] = -0.44350687;
      opj_v4dwt_decode_step2_sse(w_00,w_01,count_00,m,c_01);
      poVar3 = (opj_v4_t *)((long)poVar3 + (ulong)(uint)(iVar2 << 4) + 0x10);
      m_00 = count_00 - iVar2;
      if (count < count_00 - iVar2) {
        m_00 = count;
      }
      c_02[2] = (float)(int)in_XMM1_Qa;
      c_02[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      c_02[0] = -0.8829111;
      c_02[1] = -0.8829111;
      opj_v4dwt_decode_step2_sse(w,poVar3,count,m_00,c_02);
      c_03[2] = (float)(int)in_XMM1_Qa;
      c_03[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      c_03[0] = 0.052980117;
      c_03[1] = 0.052980117;
      opj_v4dwt_decode_step2_sse(w_00,w_01,count_00,m,c_03);
      c_04[2] = (float)(int)in_XMM1_Qa;
      c_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      c_04[0] = 1.5861343;
      c_04[1] = 1.5861343;
      opj_v4dwt_decode_step2_sse(w,poVar3,count,m_00,c_04);
      return;
    }
  }
  return;
}

Assistant:

static void opj_v4dwt_decode(opj_v4dwt_t* OPJ_RESTRICT dwt)
{
	OPJ_INT32 a, b;
	if(dwt->cas == 0) {
		if(!((dwt->dn > 0) || (dwt->sn > 1))){
			return;
		}
		a = 0;
		b = 1;
	}else{
		if(!((dwt->sn > 0) || (dwt->dn > 1))) {
			return;
		}
		a = 1;
		b = 0;
	}
#ifdef __SSE__
	opj_v4dwt_decode_step1_sse(dwt->wavelet+a, dwt->sn, _mm_set1_ps(opj_K));
	opj_v4dwt_decode_step1_sse(dwt->wavelet+b, dwt->dn, _mm_set1_ps(opj_c13318));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), _mm_set1_ps(opj_dwt_delta));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), _mm_set1_ps(opj_dwt_gamma));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), _mm_set1_ps(opj_dwt_beta));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), _mm_set1_ps(opj_dwt_alpha));
#else
	opj_v4dwt_decode_step1(dwt->wavelet+a, dwt->sn, opj_K);
	opj_v4dwt_decode_step1(dwt->wavelet+b, dwt->dn, opj_c13318);
	opj_v4dwt_decode_step2(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), opj_dwt_delta);
	opj_v4dwt_decode_step2(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), opj_dwt_gamma);
	opj_v4dwt_decode_step2(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), opj_dwt_beta);
	opj_v4dwt_decode_step2(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), opj_dwt_alpha);
#endif
}